

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseInitial(Ver_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  Ver_Stream_t *p_00;
  char cVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pObj;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  char Symbol;
  char *pEquation;
  char *pWord;
  int fStopAfterOne;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pNode;
  Ver_Stream_t *p;
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  p_00 = pMan->pReader;
  pEquation = Ver_ParseGetName(pMan);
  if (pEquation == (char *)0x0) {
    pMan_local._4_4_ = 0;
  }
  else {
    iVar2 = strcmp(pEquation,"begin");
    do {
      if (iVar2 == 0) {
        pEquation = Ver_ParseGetName(pMan);
        if (pEquation == (char *)0x0) {
          return 0;
        }
        iVar3 = strcmp(pEquation,"end");
        if (iVar3 == 0) break;
      }
      pObj = Ver_ParseFindNet(pNtk,pEquation);
      if (pObj == (Abc_Obj_t *)0x0) {
        sprintf(pMan->sError,
                "Cannot read the initial statement for %s (output wire is not defined).",pEquation);
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
      cVar1 = Ver_StreamPopChar(p_00);
      if ((cVar1 != '<') && (cVar1 != '=')) {
        sprintf(pMan->sError,"Cannot read the assign statement for %s (expected <= or =).",pEquation
               );
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
      if (cVar1 == '<') {
        Ver_StreamPopChar(p_00);
      }
      iVar3 = Ver_ParseSkipComments(pMan);
      if (iVar3 == 0) {
        return 0;
      }
      pcVar4 = Ver_StreamGetWord(p_00,";");
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      iVar3 = Abc_ObjFaninNum(pObj);
      if (iVar3 == 0) {
        sprintf(pMan->sError,"Cannot find the latch to assign the initial value.");
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
      pAVar5 = Abc_ObjFanin0(pObj);
      pAVar5 = Abc_ObjFanin0(pAVar5);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 == 0) {
        __assert_fail("Abc_ObjIsLatch(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x41c,"int Ver_ParseInitial(Ver_Man_t *, Abc_Ntk_t *)");
      }
      iVar3 = strcmp(pcVar4,"0");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar4,"1\'b0"), iVar3 == 0)) {
        Abc_LatchSetInit0(pAVar5);
      }
      else {
        iVar3 = strcmp(pcVar4,"1");
        if ((iVar3 != 0) && (iVar3 = strcmp(pcVar4,"1\'b1"), iVar3 != 0)) {
          pcVar4 = Abc_ObjName(pObj);
          sprintf(pMan->sError,"Incorrect initial value of the latch %s.",pcVar4);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        Abc_LatchSetInit1(pAVar5);
      }
      cVar1 = Ver_StreamPopChar(p_00);
      if (cVar1 != ';') {
        __assert_fail("Symbol == \';\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x42c,"int Ver_ParseInitial(Ver_Man_t *, Abc_Ntk_t *)");
      }
    } while (iVar2 == 0);
    pMan_local._4_4_ = 1;
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseInitial( Ver_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNode, * pNet;
    int fStopAfterOne;
    char * pWord, * pEquation;
    char Symbol;
    // parse the directive 
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;
    // decide how many statements to parse
    fStopAfterOne = 0;
    if ( strcmp( pWord, "begin" ) )
        fStopAfterOne = 1;
    // iterate over the initial states
    while ( 1 )
    {
        if ( !fStopAfterOne )
        {
            // get the name of the output signal
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // look for the end of directive
            if ( !strcmp( pWord, "end" ) )
                break;
        }
        // get the fanout net
        pNet = Ver_ParseFindNet( pNtk, pWord );
        if ( pNet == NULL )
        {
            sprintf( pMan->sError, "Cannot read the initial statement for %s (output wire is not defined).", pWord );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        // get the equality sign
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol != '<' && Symbol != '=' )
        {
            sprintf( pMan->sError, "Cannot read the assign statement for %s (expected <= or =).", pWord );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        if ( Symbol == '<' )
            Ver_StreamPopChar(p);
        // skip the comments
        if ( !Ver_ParseSkipComments( pMan ) )
            return 0;
        // get the second name
        pEquation = Ver_StreamGetWord( p, ";" );
        if ( pEquation == NULL )
            return 0;
        // find the corresponding latch
        if ( Abc_ObjFaninNum(pNet) == 0 )
        {
            sprintf( pMan->sError, "Cannot find the latch to assign the initial value." );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        pNode = Abc_ObjFanin0(Abc_ObjFanin0(pNet));
        assert( Abc_ObjIsLatch(pNode) );
        // set the initial state
        if ( !strcmp(pEquation, "0") || !strcmp(pEquation, "1\'b0") )
            Abc_LatchSetInit0( pNode );
        else if ( !strcmp(pEquation, "1") || !strcmp(pEquation, "1\'b1") )
            Abc_LatchSetInit1( pNode );
//        else if ( !strcmp(pEquation, "2") )
//            Abc_LatchSetInitDc( pNode );
        else 
        {
            sprintf( pMan->sError, "Incorrect initial value of the latch %s.", Abc_ObjName(pNet) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        // remove the last symbol
        Symbol = Ver_StreamPopChar(p);
        assert( Symbol == ';' );
        // quit if only one directive
        if ( fStopAfterOne )
            break;
    }
    return 1;
}